

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

VarId refill(map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             *redundantphi,VarId *name)

{
  uint32_t *puVar1;
  long in_RDX;
  _func_int **pp_Var2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  VarId VVar6;
  
  puVar4 = (uint32_t *)name[1].super_Displayable._vptr_Displayable;
  puVar3 = &name->id;
  puVar1 = puVar3;
  if (puVar4 != (uint32_t *)0x0) {
    do {
      bVar5 = puVar4[10] < *(uint *)(in_RDX + 8);
      if (!bVar5) {
        puVar1 = puVar4;
      }
      puVar4 = *(uint32_t **)(puVar4 + (ulong)bVar5 * 2 + 4);
    } while (puVar4 != (uint32_t *)0x0);
  }
  puVar4 = puVar3;
  if ((puVar1 != puVar3) && (puVar4 = puVar1, *(uint *)(in_RDX + 8) < puVar1[10])) {
    puVar4 = puVar3;
  }
  pp_Var2 = (_func_int **)(in_RDX + 8);
  if (puVar4 != puVar3) {
    pp_Var2 = (_func_int **)(puVar4 + 0xe);
  }
  *(undefined ***)&(redundantphi->_M_t)._M_impl = &PTR_display_001ee058;
  (redundantphi->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = *(_Rb_tree_color *)pp_Var2
  ;
  VVar6._8_8_ = pp_Var2;
  VVar6.super_Displayable._vptr_Displayable = (_func_int **)redundantphi;
  return VVar6;
}

Assistant:

mir::inst::VarId refill(map<mir::inst::VarId, mir::inst::VarId> redundantphi,
                        mir::inst::VarId name) {
  map<mir::inst::VarId, mir::inst::VarId>::iterator it =
      redundantphi.find(name);
  if (it == redundantphi.end()) {
    return name;
  } else {
    return it->second;
  }
}